

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O2

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath
          (ScriptContextOptimizationOverrideInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContextOptimizationOverrideInfo *pSVar4;
  
  if (this->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
    this->arraySetElementFastPathVtable = 1;
    this->intArraySetElementFastPathVtable = 1;
    this->floatArraySetElementFastPathVtable = 1;
  }
  else if (this->arraySetElementFastPathVtable != 1) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pSVar4 = this;
    do {
      if (pSVar4->arraySetElementFastPathVtable == 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,200,"(info->IsEnabledArraySetElementFastPath())",
                                    "info->IsEnabledArraySetElementFastPath()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pSVar4->arraySetElementFastPathVtable = 1;
      pSVar4->intArraySetElementFastPathVtable = 1;
      pSVar4->floatArraySetElementFastPathVtable = 1;
      pSVar4 = pSVar4->crossSiteNext;
    } while (pSVar4 != this);
  }
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath()
{
    if (this->crossSiteRoot == nullptr)
    {
        arraySetElementFastPathVtable = InvalidVtable;
        intArraySetElementFastPathVtable = InvalidVtable;
        floatArraySetElementFastPathVtable = InvalidVtable;
    }
    else if (IsEnabledArraySetElementFastPath())
    {
        // disable for all script context in the cross site group
        ForEachCrossSiteInfo([](ScriptContextOptimizationOverrideInfo * info)
        {
            Assert(info->IsEnabledArraySetElementFastPath());
            info->arraySetElementFastPathVtable = InvalidVtable;
            info->intArraySetElementFastPathVtable = InvalidVtable;
            info->floatArraySetElementFastPathVtable = InvalidVtable;
        });
    }
}